

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * anon_unknown.dwarf_ac7333::relativeIfUnder
                   (string *__return_storage_ptr__,string *top,string *cur,string *path)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  string *extraout_RAX;
  
  bVar2 = cmsys::SystemTools::IsSubDirectory(path,cur);
  if (bVar2) {
LAB_002e03a2:
    psVar3 = cmSystemTools::ForceToRelativePath(__return_storage_ptr__,cur,path);
    return psVar3;
  }
  bVar2 = cmsys::SystemTools::IsSubDirectory(cur,top);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::IsSubDirectory(path,top);
    if (bVar2) goto LAB_002e03a2;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  return extraout_RAX;
}

Assistant:

std::string relativeIfUnder(std::string const& top, std::string const& cur,
                            std::string const& path)
{
  // Use a path relative to 'cur' if it can be expressed without
  // a `../` sequence that leaves 'top'.
  if (cmSystemTools::IsSubDirectory(path, cur) ||
      (cmSystemTools::IsSubDirectory(cur, top) &&
       cmSystemTools::IsSubDirectory(path, top))) {
    return cmSystemTools::ForceToRelativePath(cur, path);
  }
  return path;
}